

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O0

void OpenSteer::
     DistanceToPathAlikeMapping<OpenSteer::PolylineSegmentedPathwaySingleRadius,_OpenSteer::PathDistanceToPointMapping,_OpenSteer::DistanceToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPathwaySingleRadius>_>
     ::map(PolylineSegmentedPathwaySingleRadius *pathAlike,float distanceOnPath,
          PathDistanceToPointMapping *mapping)

{
  ulong uVar1;
  long lVar2;
  PathDistanceToPointMapping *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float radius;
  Vec3 tangent;
  Vec3 pointOnPathCenterLine;
  size_type maxSegmentIndex;
  size_type segmentIndex;
  float remainingDistance;
  float pathLength;
  float *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb4;
  Vec3 *in_stack_ffffffffffffffb8;
  PolylineSegmentedPathwaySingleRadius *in_stack_ffffffffffffffc0;
  ulong local_30;
  float local_24;
  float local_20;
  float local_1c;
  PathDistanceToPointMapping *local_18;
  float local_c;
  long *local_8;
  
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  local_1c = (float)(**(code **)(*in_RDI + 0x38))();
  uVar1 = (**(code **)(*local_8 + 0x30))();
  if ((uVar1 & 1) != 0) {
    local_c = modulo(0.0,2.041982e-39);
  }
  local_20 = 0.0;
  local_24 = clamp<float>(&local_c,&local_20,&local_1c);
  local_30 = 0;
  local_c = local_24;
  lVar2 = (**(code **)(*local_8 + 0x50))();
  while( true ) {
    in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 & 0xffffff;
    if (local_30 < lVar2 - 1U) {
      in_stack_ffffffffffffffa4 = local_24;
      fVar3 = (float)(**(code **)(*local_8 + 0x58))(local_8,local_30);
      in_stack_ffffffffffffffa8 =
           CONCAT13(fVar3 < in_stack_ffffffffffffffa4,(int3)in_stack_ffffffffffffffa8);
    }
    if ((char)(in_stack_ffffffffffffffa8 >> 0x18) == '\0') break;
    fVar3 = (float)(**(code **)(*local_8 + 0x58))(local_8,local_30);
    local_24 = local_24 - fVar3;
    local_30 = local_30 + 1;
  }
  Vec3::Vec3((Vec3 *)&stack0xffffffffffffffbc,0.0,0.0,0.0);
  Vec3::Vec3((Vec3 *)&stack0xffffffffffffffb0,0.0,0.0,0.0);
  fVar3 = 0.0;
  DistanceToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPathwaySingleRadius>::
  extract(in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
          (Vec3 *)(ulong)in_stack_ffffffffffffffa8,
          (Vec3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          in_stack_ffffffffffffff98);
  PathDistanceToPointMapping::setPointOnPathCenterLine
            ((PathDistanceToPointMapping *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  PathDistanceToPointMapping::setRadius(local_18,fVar3);
  PathDistanceToPointMapping::setTangent(local_18,(Vec3 *)&stack0xffffffffffffffb0);
  PathDistanceToPointMapping::setSegmentIndex(local_18,local_30);
  PathDistanceToPointMapping::setDistanceOnPath(local_18,local_c);
  PathDistanceToPointMapping::setDistanceOnSegment(local_18,local_24);
  return;
}

Assistant:

static void map( PathAlike const& pathAlike, float distanceOnPath, Mapping& mapping ) {
            float const pathLength = pathAlike.length();
            
            // Modify @c distanceOnPath to applicable values.
            if ( pathAlike.isCyclic() ) {
                distanceOnPath = modulo( distanceOnPath, pathLength );       
            }
            distanceOnPath = clamp( distanceOnPath, 0.0f, pathLength );
            
            // Which path alike segment is reached by @c distanceOnPath?
            float remainingDistance = distanceOnPath;
            typedef typename PathAlike::size_type size_type;
            size_type segmentIndex = 0;        
            size_type const maxSegmentIndex = pathAlike.segmentCount() - 1;
            while( ( segmentIndex < maxSegmentIndex ) && 
                   ( remainingDistance > pathAlike.segmentLength( segmentIndex ) ) ) {
                remainingDistance -= pathAlike.segmentLength( segmentIndex );
                ++segmentIndex;
            }
            
            // Extract the path related data associated with the segment reached
            // by @c distanceOnPath.
            Vec3 pointOnPathCenterLine( 0.0f, 0.0f, 0.0f );
            Vec3 tangent( 0.0f, 0.0f, 0.0f );
            float radius = 0.0f;
            BaseDataExtractionPolicy::extract( pathAlike, segmentIndex, remainingDistance, pointOnPathCenterLine, tangent, radius );
            
            // Store the extracted data in @c mapping to return it to the caller.
            mapping.setPointOnPathCenterLine( pointOnPathCenterLine );
            mapping.setRadius( radius );
            mapping.setTangent( tangent );
            mapping.setSegmentIndex( segmentIndex );
            mapping.setDistanceOnPath( distanceOnPath );
            mapping.setDistanceOnSegment( remainingDistance );            
        }